

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.cc
# Opt level: O3

void bloaty::ReadDWARFInlines(File *file,RangeSink *sink,bool include_line)

{
  long *plVar1;
  uint16_t uVar2;
  pointer pAVar3;
  uint64_t uVar4;
  uint32_t __val;
  char cVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  Abbrev *pAVar9;
  string *psVar10;
  undefined8 *puVar11;
  uint32_t uVar12;
  uint uVar13;
  undefined7 in_register_00000011;
  size_type sVar14;
  uint64_t uVar15;
  _Alloc_hider _Var16;
  char *pcVar17;
  pointer pAVar18;
  uint64_t vmaddr;
  _Storage<unsigned_long,_true> unaff_R15;
  optional<unsigned_long> oVar19;
  string last_source;
  LineInfoReader line_info_reader;
  InfoReader reader;
  CUIter iter;
  CU cu;
  long *local_2d8;
  size_t local_2d0;
  long local_2c8;
  undefined8 uStack_2c0;
  anon_union_16_2_fba5e7b8_for_AttrValue_0 local_2b8;
  char *local_2a8 [2];
  anon_union_16_2_fba5e7b8_for_AttrValue_0 local_298;
  char *local_288 [2];
  string local_278;
  undefined4 local_254;
  RangeSink *local_250;
  DIEReader local_248;
  LineInfoReader local_230;
  InfoReader local_180;
  CUIter local_100;
  CU local_e8;
  
  local_254 = (undefined4)CONCAT71(in_register_00000011,include_line);
  local_250 = sink;
  if (((file->debug_info)._M_len == 0) || ((file->debug_line)._M_len == 0)) {
    Throw("no debug info",0x2d1);
  }
  local_180.skeleton_ = (CU *)0x0;
  local_180.stmt_list_map_._M_h._M_buckets = &local_180.stmt_list_map_._M_h._M_single_bucket;
  local_180.stmt_list_map_._M_h._M_bucket_count = 1;
  local_180.stmt_list_map_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_180.stmt_list_map_._M_h._M_element_count = 0;
  local_180.stmt_list_map_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_180.stmt_list_map_._M_h._M_rehash_policy._M_next_resize = 0;
  local_180.stmt_list_map_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_180.abbrev_tables_._M_h._M_buckets = &local_180.abbrev_tables_._M_h._M_single_bucket;
  local_180.abbrev_tables_._M_h._M_bucket_count = 1;
  local_180.abbrev_tables_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_180.abbrev_tables_._M_h._M_element_count = 0;
  local_180.abbrev_tables_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_180.abbrev_tables_._M_h._M_rehash_policy._M_next_resize = 0;
  local_180.abbrev_tables_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_180.dwarf_ = file;
  dwarf::InfoReader::GetCUIter(&local_100,&local_180,kDebugInfo,0);
  local_e8.unit_name_._M_dataplus._M_p = (pointer)&local_e8.unit_name_.field_2;
  local_e8.data_._M_len = 0;
  local_e8.data_._M_str = (char *)0x0;
  local_e8.entire_unit_._M_len = 0;
  local_e8.entire_unit_._M_str = (char *)0x0;
  local_e8.unit_name_._M_string_length = 0;
  local_e8.unit_name_.field_2._M_local_buf[0] = '\0';
  local_e8.addr_base_ = 0;
  local_e8.str_offsets_base_ = 0;
  local_e8.range_lists_base_ = 0;
  local_e8.strp_callback_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_e8.strp_callback_.super__Function_base._M_functor._8_8_ = 0;
  local_e8.strp_callback_.super__Function_base._M_manager = (_Manager_type)0x0;
  local_e8.strp_callback_._M_invoker = (_Invoker_type)0x0;
  local_248.remaining_._M_len = 0;
  local_248.remaining_._M_str = (char *)0x0;
  local_248.depth_ = 0;
  local_230.info_.address = 0;
  local_230.include_directories_.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_230.include_directories_.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_230.include_directories_.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_230.filenames_.
  super__Vector_base<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_230.filenames_.
  super__Vector_base<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_230.filenames_.
  super__Vector_base<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_230.standard_opcode_lengths_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_230.standard_opcode_lengths_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_230.standard_opcode_lengths_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_230.expanded_filenames_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_230.expanded_filenames_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_230.expanded_filenames_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_230.remaining_._M_len = 0;
  local_230.remaining_._M_str = (char *)0x0;
  local_230.info_.file = 1;
  local_230.info_.line = 1;
  local_230.info_._16_7_ = 0;
  local_230.info_.discriminator._3_1_ = 0;
  local_230.info_.end_sequence = false;
  local_230.info_.basic_block = false;
  local_230.info_.prologue_end = false;
  local_230.info_.epilogue_begin = false;
  local_230.info_.is_stmt = false;
  local_230.info_.op_index = '\0';
  local_230.info_.isa = '\0';
  local_230.file_ = file;
  bVar6 = dwarf::CUIter::NextCU(&local_100,&local_180,&local_e8);
  if (!bVar6) {
    Throw("debug info is present, but empty",0x2db);
  }
  do {
    do {
      do {
        pAVar9 = dwarf::DIEReader::ReadCode(&local_248,&local_e8);
        if (pAVar9 == (Abbrev *)0x0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_230.expanded_filenames_);
          if (local_230.standard_opcode_lengths_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_230.standard_opcode_lengths_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_230.standard_opcode_lengths_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_230.standard_opcode_lengths_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_230.filenames_.
              super__Vector_base<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_230.filenames_.
                            super__Vector_base<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_230.filenames_.
                                  super__Vector_base<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_230.filenames_.
                                  super__Vector_base<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_230.include_directories_.
              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_230.include_directories_.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_230.include_directories_.
                                  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_230.include_directories_.
                                  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_e8.strp_callback_.super__Function_base._M_manager != (_Manager_type)0x0) {
            (*local_e8.strp_callback_.super__Function_base._M_manager)
                      ((_Any_data *)&local_e8.strp_callback_,(_Any_data *)&local_e8.strp_callback_,
                       __destroy_functor);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8.unit_name_._M_dataplus._M_p != &local_e8.unit_name_.field_2) {
            operator_delete(local_e8.unit_name_._M_dataplus._M_p,
                            CONCAT71(local_e8.unit_name_.field_2._M_allocated_capacity._1_7_,
                                     local_e8.unit_name_.field_2._M_local_buf[0]) + 1);
          }
          std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_bloaty::dwarf::AbbrevTable>,_std::allocator<std::pair<const_unsigned_long,_bloaty::dwarf::AbbrevTable>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable(&local_180.abbrev_tables_._M_h);
          std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable(&local_180.stmt_list_map_._M_h);
          return;
        }
        pAVar18 = (pAVar9->attr).
                  super__Vector_base<bloaty::dwarf::AbbrevTable::Attribute,_std::allocator<bloaty::dwarf::AbbrevTable::Attribute>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pAVar3 = (pAVar9->attr).
                 super__Vector_base<bloaty::dwarf::AbbrevTable::Attribute,_std::allocator<bloaty::dwarf::AbbrevTable::Attribute>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      } while (pAVar18 == pAVar3);
      uVar13 = 0;
      do {
        uVar2 = pAVar18->name;
        dwarf::AttrValue::ParseAttr
                  ((AttrValue *)&local_298.string_,&local_e8,pAVar18->form,&local_248.remaining_);
        local_2a8[0] = local_288[0];
        local_2b8.string_._M_str = (char *)CONCAT44(local_298._12_4_,local_298._8_4_);
        local_2b8.uint_ = local_298.uint_;
        if (uVar2 == 0x10) {
          oVar19 = dwarf::AttrValue::ToUint((AttrValue *)&local_2b8.string_,&local_e8);
          unaff_R15._M_value =
               oVar19.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long>._M_payload;
          uVar13 = oVar19.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_long>._8_4_;
        }
        pAVar18 = pAVar18 + 1;
      } while (pAVar18 != pAVar3);
    } while ((uVar13 & 1) == 0);
    dwarf::LineInfoReader::SeekToOffset
              (&local_230,unaff_R15._M_value,local_e8.unit_sizes_.addr8_ * '\x04' + '\x04');
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    local_278._M_string_length = 0;
    local_278.field_2._M_local_buf[0] = '\0';
    vmaddr = 0;
    while (bVar6 = dwarf::LineInfoReader::ReadLineInfo(&local_230), uVar4 = local_230.info_.address,
          bVar6) {
      sVar14 = local_278._M_string_length;
      _Var16._M_p = local_278._M_dataplus._M_p;
      if (local_230.info_.end_sequence == true) {
LAB_001b593d:
        local_2d8 = &local_2c8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2d8,_Var16._M_p,_Var16._M_p + sVar14);
      }
      else {
        __val = local_230.info_.line;
        psVar10 = dwarf::LineInfoReader::GetExpandedFilename_abi_cxx11_
                            (&local_230,local_230.info_._8_8_ & 0xffffffff);
        _Var16._M_p = (psVar10->_M_dataplus)._M_p;
        sVar14 = psVar10->_M_string_length;
        if ((char)local_254 == '\0') goto LAB_001b593d;
        local_2b8.uint_ = (uint64_t)local_2a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2b8,_Var16._M_p,_Var16._M_p + psVar10->_M_string_length);
        std::__cxx11::string::append((char *)&local_2b8.uint_);
        cVar7 = '\x01';
        if (9 < __val) {
          uVar12 = __val;
          cVar5 = '\x04';
          do {
            cVar7 = cVar5;
            if (uVar12 < 100) {
              cVar7 = cVar7 + -2;
              goto LAB_001b59f2;
            }
            if (uVar12 < 1000) {
              cVar7 = cVar7 + -1;
              goto LAB_001b59f2;
            }
            if (uVar12 < 10000) goto LAB_001b59f2;
            bVar6 = 99999 < uVar12;
            uVar12 = uVar12 / 10000;
            cVar5 = cVar7 + '\x04';
          } while (bVar6);
          cVar7 = cVar7 + '\x01';
        }
LAB_001b59f2:
        local_298.uint_ = (uint64_t)local_288;
        std::__cxx11::string::_M_construct((ulong)&local_298,cVar7);
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)local_298.uint_,local_298._8_4_,__val);
        pcVar17 = (char *)0xf;
        if ((char **)local_2b8.uint_ != local_2a8) {
          pcVar17 = local_2a8[0];
        }
        if (pcVar17 < local_2b8.string_._M_str + CONCAT44(local_298._12_4_,local_298._8_4_)) {
          pcVar17 = (char *)0xf;
          if ((char **)local_298.uint_ != local_288) {
            pcVar17 = local_288[0];
          }
          if (pcVar17 < local_2b8.string_._M_str + CONCAT44(local_298._12_4_,local_298._8_4_))
          goto LAB_001b5a69;
          puVar11 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,local_2b8.uint_);
        }
        else {
LAB_001b5a69:
          puVar11 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_2b8.uint_,local_298.uint_);
        }
        plVar1 = puVar11 + 2;
        if ((long *)*puVar11 == plVar1) {
          local_2c8 = *plVar1;
          uStack_2c0 = puVar11[3];
          local_2d8 = &local_2c8;
        }
        else {
          local_2c8 = *plVar1;
          local_2d8 = (long *)*puVar11;
        }
        local_2d0 = puVar11[1];
        *puVar11 = plVar1;
        puVar11[1] = 0;
        *(undefined1 *)plVar1 = 0;
        if ((char **)local_298.uint_ != local_288) {
          operator_delete((void *)local_298.uint_,(ulong)(local_288[0] + 1));
        }
        if ((char **)local_2b8.uint_ != local_2a8) {
          operator_delete((void *)local_2b8.uint_,(ulong)(local_2a8[0] + 1));
        }
      }
      uVar15 = uVar4;
      if ((vmaddr != 0) &&
         (((local_230.info_.end_sequence != false ||
           ((uVar15 = vmaddr, local_278._M_string_length != 0 &&
            ((local_2d0 != local_278._M_string_length ||
             (iVar8 = bcmp(local_2d8,local_278._M_dataplus._M_p,local_278._M_string_length),
             iVar8 != 0)))))) &&
          (RangeSink::AddVMRange(local_250,"dwarf_stmtlist",vmaddr,uVar4 - vmaddr,&local_278),
          uVar15 = uVar4, local_230.info_.end_sequence != false)))) {
        uVar15 = 0;
      }
      std::__cxx11::string::_M_assign((string *)&local_278);
      vmaddr = uVar15;
      if (local_2d8 != &local_2c8) {
        operator_delete(local_2d8,local_2c8 + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,
                      CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                               local_278.field_2._M_local_buf[0]) + 1);
    }
  } while( true );
}

Assistant:

void ReadDWARFInlines(const dwarf::File& file, RangeSink* sink,
                      bool include_line) {
  if (!file.debug_info.size() || !file.debug_line.size()) {
    THROW("no debug info");
  }

  dwarf::InfoReader reader(file);
  dwarf::CUIter iter = reader.GetCUIter(dwarf::InfoReader::Section::kDebugInfo);
  dwarf::CU cu;
  dwarf::DIEReader die_reader = cu.GetDIEReader();
  dwarf::LineInfoReader line_info_reader(file);

  if (!iter.NextCU(reader, &cu)) {
    THROW("debug info is present, but empty");
  }

  while (auto abbrev = die_reader.ReadCode(cu)) {
    absl::optional<uint64_t> stmt_list;
    die_reader.ReadAttributes(
        cu, abbrev, [&stmt_list, &cu](uint16_t tag, dwarf::AttrValue val) {
          if (tag == DW_AT_stmt_list) {
            stmt_list = val.ToUint(cu);
          }
        });

    if (stmt_list) {
      line_info_reader.SeekToOffset(*stmt_list, cu.unit_sizes().address_size());
      ReadDWARFStmtList(include_line, &line_info_reader, sink);
    }
  }
}